

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall FCompressedFile::Implode(FCompressedFile *this)

{
  uchar *__src;
  uint *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  ulong __n;
  uint local_60;
  DWORD *lens;
  int r;
  BYTE *oldbuf;
  Byte *compressed;
  uLong len;
  uLong outlen;
  FCompressedFile *this_local;
  
  uVar5 = this->m_BufferSize;
  __n = (ulong)uVar5;
  oldbuf = (BYTE *)0x0;
  __src = this->m_Buffer;
  outlen = (uLong)this;
  bVar2 = FBoolCVar::operator_cast_to_bool(&nofilecompression);
  if ((bVar2) || ((this->m_NoCompress & 1U) != 0)) {
    len = 0;
  }
  else {
    len = __n + __n / 1000 + 0xc;
    do {
      oldbuf = (BYTE *)operator_new__(len);
      iVar3 = compress(oldbuf,&len,this->m_Buffer,__n);
      if (iVar3 == -5) {
        if (oldbuf != (BYTE *)0x0) {
          operator_delete__(oldbuf);
        }
        len = len + 0x400;
      }
    } while (iVar3 == -5);
    if ((iVar3 == 0) && (len < __n)) {
      DPrintf(4,"cfile shrank from %lu to %lu bytes\n",__n,len);
    }
    else {
      DPrintf(4,"cfile could not be compressed\n");
      len = 0;
    }
  }
  local_60 = uVar5;
  if (len != 0) {
    local_60 = (uint)len;
  }
  this->m_BufferSize = local_60;
  this->m_MaxBufferSize = local_60;
  puVar6 = (uchar *)M_Malloc_Dbg((ulong)(this->m_BufferSize + 8),
                                 "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/farchive.cpp"
                                 ,0x173);
  this->m_Buffer = puVar6;
  this->m_Pos = 0;
  puVar1 = (uint *)this->m_Buffer;
  uVar4 = BigLong((uint)len);
  *puVar1 = uVar4;
  uVar5 = BigLong(uVar5);
  puVar1[1] = uVar5;
  if (len == 0) {
    memcpy(this->m_Buffer + 8,__src,__n);
  }
  else {
    memcpy(this->m_Buffer + 8,oldbuf,len);
  }
  if ((oldbuf != (BYTE *)0x0) && (oldbuf != (BYTE *)0x0)) {
    operator_delete__(oldbuf);
  }
  M_Free(__src);
  return;
}

Assistant:

void FCompressedFile::Implode ()
{
	uLong outlen;
	uLong len = m_BufferSize;
	Byte *compressed = NULL;
	BYTE *oldbuf = m_Buffer;
	int r;

	if (!nofilecompression && !m_NoCompress)
	{
		outlen = OUT_LEN(len);
		do
		{
			compressed = new Bytef[outlen];
			r = compress (compressed, &outlen, m_Buffer, len);
			if (r == Z_BUF_ERROR)
			{
				delete[] compressed;
				outlen += 1024;
			}
		} while (r == Z_BUF_ERROR);

		// If the data could not be compressed, store it as-is.
		if (r != Z_OK || outlen >= len)
		{
			DPrintf (DMSG_SPAMMY, "cfile could not be compressed\n");
			outlen = 0;
		}
		else
		{
			DPrintf (DMSG_SPAMMY, "cfile shrank from %lu to %lu bytes\n", len, outlen);
		}
	}
	else
	{
		outlen = 0;
	}

	m_MaxBufferSize = m_BufferSize = ((outlen == 0) ? len : outlen);
	m_Buffer = (BYTE *)M_Malloc (m_BufferSize + 8);
	m_Pos = 0;

	DWORD *lens = (DWORD *)(m_Buffer);
	lens[0] = BigLong((unsigned int)outlen);
	lens[1] = BigLong((unsigned int)len);

	if (outlen == 0)
		memcpy (m_Buffer + 8, oldbuf, len);
	else
		memcpy (m_Buffer + 8, compressed, outlen);
	if (compressed)
		delete[] compressed;
	M_Free (oldbuf);
}